

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O2

BOOL Js::JavascriptArray::TryTemplatedGetItem<Js::TypedArrayBase,unsigned_int>
               (RecyclableObject *arr,uint index,Var *element,ScriptContext *scriptContext,
               bool checkHasItem)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *scriptContext_00;
  
  scriptContext_00 = scriptContext;
  bVar1 = VarIsImpl<Js::TypedArrayBase>(arr);
  if (bVar1) {
    BVar2 = TemplatedGetItem<Js::TypedArrayBase>
                      ((TypedArrayBase *)arr,index,element,scriptContext_00,checkHasItem);
    return BVar2;
  }
  BVar2 = JavascriptOperators::GetItem(arr,index,element,scriptContext);
  return BVar2;
}

Assistant:

static BOOL TryTemplatedGetItem(RecyclableObject* arr, P index, Var *element, ScriptContext *scriptContext, bool checkHasItem = true)
        {
            return VarIsWithoutES5Array<T>(arr) ? JavascriptArray::TemplatedGetItem(static_cast<T*>(arr), index, element, scriptContext, checkHasItem) :
                JavascriptOperators::GetItem(arr, index, element, scriptContext);
        }